

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_local_polynomial.hpp
# Opt level: O3

pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double> * __thiscall
openjij::system::KLocalPolynomial<openjij::graph::Polynomial<double>_>::FindMinInteraction
          (pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_double>
           *__return_storage_ptr__,KLocalPolynomial<openjij::graph::Polynomial<double>_> *this,
          double threshold)

{
  double dVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  pointer pvVar2;
  runtime_error *prVar3;
  ulong uVar4;
  pointer pvVar5;
  long lVar6;
  double dVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> min_key;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  __x = (this->poly_key_list_).
        super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if ((this->poly_key_list_).
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == __x) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Interactions are empty.");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  dVar7 = *(this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,__x);
  pvVar5 = (this->poly_key_list_).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->poly_key_list_).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar2 != pvVar5) {
    lVar6 = 0;
    uVar4 = 0;
    do {
      dVar1 = (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4];
      if ((((dVar1 != 0.0) || (NAN(dVar1))) && (ABS(dVar1) < ABS(dVar7))) &&
         (threshold < ABS(dVar1))) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (&local_48,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&(pvVar5->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar6));
        pvVar5 = (this->poly_key_list_).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (this->poly_key_list_).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        dVar7 = dVar1;
      }
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 0x18;
    } while (uVar4 < (ulong)(((long)pvVar2 - (long)pvVar5 >> 3) * -0x5555555555555555));
  }
  if (ABS(dVar7) <= threshold) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"No minimum value in interactions");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&__return_storage_ptr__->first,&local_48);
  __return_storage_ptr__->second = dVar7;
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<graph::Index>, FloatType>
  FindMinInteraction(const FloatType threshold = 0.0) const {
    if (poly_key_list_.size() == 0) {
      throw std::runtime_error("Interactions are empty.");
    }
    FloatType min_val = poly_value_list_[0];
    std::vector<graph::Index> min_key = poly_key_list_[0];
    for (std::size_t i = 0; i < poly_key_list_.size(); ++i) {
      if (poly_value_list_[i] != 0.0 &&
          std::abs(poly_value_list_[i]) < std::abs(min_val) &&
          threshold < std::abs(poly_value_list_[i])) {
        min_val = poly_value_list_[i];
        min_key = poly_key_list_[i];
      }
    }

    if (std::abs(min_val) <= threshold) {
      throw std::runtime_error("No minimum value in interactions");
    }
    return std::pair<std::vector<graph::Index>, FloatType>(min_key, min_val);
  }